

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbuilder_pbx.cpp
# Opt level: O2

void __thiscall
ProjectBuilderSources::ProjectBuilderSources
          (ProjectBuilderSources *this,QString *k,bool b,QString *c,bool o)

{
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  bool bVar4;
  char *ch;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_b8;
  QStringBuilder<QString,_const_QString_&> local_98;
  QStringBuilder<QStringBuilder<QString,_const_QString_&>,_const_char_(&)[2]> local_70;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this->buildable = b;
  this->object_output = o;
  QArrayDataPointer<char16_t>::QArrayDataPointer(&(this->key).d,&k->d);
  (this->group).d.d = (Data *)0x0;
  (this->group).d.ptr = (char16_t *)0x0;
  (this->group).d.size = 0;
  QArrayDataPointer<char16_t>::QArrayDataPointer(&(this->compiler).d,&c->d);
  bVar4 = comparesEqual(k,"SOURCES");
  if (!bVar4) {
    bVar4 = comparesEqual(k,"OBJECTIVE_SOURCES");
    if (!bVar4) {
      bVar4 = comparesEqual(k,"HEADERS");
      if (!bVar4) {
        bVar4 = comparesEqual(k,"QMAKE_INTERNAL_INCLUDED_FILES");
        if (bVar4) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
            ch = "Supporting Files";
            goto LAB_0012b296;
          }
          goto LAB_0012b436;
        }
        bVar4 = comparesEqual(k,"GENERATED_SOURCES");
        if (!bVar4) {
          bVar4 = comparesEqual(k,"GENERATED_FILES");
          if (!bVar4) {
            bVar4 = comparesEqual(k,"RESOURCES");
            if (bVar4) {
              if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
                ch = "Resources";
                goto LAB_0012b296;
              }
            }
            else {
              if ((this->group).d.ptr == (char16_t *)0x0) {
                QString::QString((QString *)&local_b8,"Sources [");
                local_98.a.d.size = local_b8.size;
                local_98.a.d.ptr = local_b8.ptr;
                local_98.a.d.d = local_b8.d;
                local_b8.d = (Data *)0x0;
                local_b8.ptr = (char16_t *)0x0;
                local_b8.size = 0;
                local_98.b = c;
                QStringBuilder<QString,_const_QString_&>::QStringBuilder(&local_70.a,&local_98);
                local_70.b = (char (*) [2])0x2242d9;
                QStringBuilder<QStringBuilder<QString,_const_QString_&>,_const_char_(&)[2]>::
                convertTo<QString>((QString *)&local_48,&local_70);
                pDVar2 = (this->group).d.d;
                pcVar3 = (this->group).d.ptr;
                (this->group).d.d = local_48.d;
                (this->group).d.ptr = local_48.ptr;
                qVar1 = (this->group).d.size;
                (this->group).d.size = local_48.size;
                local_48.d = pDVar2;
                local_48.ptr = pcVar3;
                local_48.size = qVar1;
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_70);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_98);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
              }
              if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
                return;
              }
            }
            goto LAB_0012b436;
          }
        }
        if (*(long *)(in_FS_OFFSET + 0x28) != local_30) goto LAB_0012b436;
        ch = "Generated Sources";
        goto LAB_0012b296;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
LAB_0012b436:
    __stack_chk_fail();
  }
  ch = "Sources";
LAB_0012b296:
  QString::operator=(&this->group,ch);
  return;
}

Assistant:

ProjectBuilderSources::ProjectBuilderSources(const QString &k, bool b, const QString &c, bool o) :
    buildable(b), object_output(o), key(k), compiler(c)
{
    // Override group name for a few common keys
    if (k == "SOURCES" || k == "OBJECTIVE_SOURCES" || k == "HEADERS")
        group = "Sources";
    else if (k == "QMAKE_INTERNAL_INCLUDED_FILES")
        group = "Supporting Files";
    else if (k == "GENERATED_SOURCES" || k == "GENERATED_FILES")
        group = "Generated Sources";
    else if (k == "RESOURCES")
        group = "Resources";
    else if (group.isNull())
        group = QString("Sources [") + c + "]";
}